

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::detail::make_content_range_header_field_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,size_t offset,size_t length,
          size_t content_length)

{
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"bytes ",(allocator<char> *)&local_40);
  std::__cxx11::to_string(&local_40,(unsigned_long)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_40,(unsigned_long)(this + (offset - 1)));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_40,length);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_content_range_header_field(size_t offset, size_t length,
                                                   size_t content_length) {
  std::string field = "bytes ";
  field += std::to_string(offset);
  field += "-";
  field += std::to_string(offset + length - 1);
  field += "/";
  field += std::to_string(content_length);
  return field;
}